

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::VariablesFbLoadForces(ChParticleCloud *this,double factor)

{
  long *plVar1;
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChSystem *pCVar9;
  ChAparticle *pCVar10;
  byte bVar11;
  bool bVar12;
  pointer ppCVar13;
  undefined1 (*pauVar14) [64];
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ChVector<double> v;
  ChVector<double> Wvel;
  double local_108 [3];
  long lStack_f0;
  double dStack_e8;
  double dStack_e0;
  double dStack_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined1 (*local_b0) [64];
  long local_a8;
  double local_98;
  double dStack_90;
  double local_80;
  double local_78;
  double local_70;
  undefined1 local_68 [16];
  double dStack_58;
  double dStack_50;
  
  auVar23._8_56_ = in_register_00001208;
  auVar23._0_8_ = factor;
  pCVar9 = (this->super_ChIndexedParticles).super_ChPhysicsItem.system;
  if (pCVar9 == (ChSystem *)0x0) {
    local_98 = 0.0;
    dStack_90 = 0.0;
    dStack_e8 = 0.0;
  }
  else {
    dStack_e8 = (this->particle_mass).mass;
    local_98 = dStack_e8 * (pCVar9->G_acc).m_data[0];
    dStack_90 = dStack_e8 * (pCVar9->G_acc).m_data[1];
    dStack_e8 = dStack_e8 * (pCVar9->G_acc).m_data[2];
  }
  ppCVar13 = (this->particles).
             super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar13) {
    _local_68 = vbroadcastsd_avx512f(auVar23._0_16_);
    uVar18 = 1;
    uVar20 = 0;
    do {
      ChFrameMoving<double>::GetWvel_loc((ChFrameMoving<double> *)ppCVar13[uVar20]);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_80;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_70;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar35._8_8_ = 0;
      auVar35._0_8_ =
           local_78 *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 8);
      auVar3 = vfmadd231sd_fma(auVar35,auVar30,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x18);
      auVar40._8_8_ = 0;
      auVar40._0_8_ =
           local_78 *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x20);
      auVar4 = vfmadd231sd_fma(auVar40,auVar30,auVar4);
      pCVar10 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar20];
      local_c0 = local_78;
      local_b8 = local_80;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x10);
      auVar3 = vfmadd231sd_fma(auVar3,auVar38,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x28);
      auVar4 = vfmadd231sd_fma(auVar4,auVar38,auVar6);
      dStack_d0 = local_70;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x30);
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           local_78 *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x38);
      auVar5 = vfmadd231sd_fma(auVar32,auVar30,auVar7);
      local_108[0] = local_98 + (pCVar10->UserForce).m_data[0];
      local_108[1] = dStack_90 + (pCVar10->UserForce).m_data[1];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x40);
      auVar5 = vfmadd231sd_fma(auVar5,auVar38,auVar8);
      local_c8 = auVar3._0_8_;
      dStack_d8 = auVar4._0_8_;
      local_108[2] = dStack_e8 + (pCVar10->UserForce).m_data[2];
      dStack_e0 = auVar5._0_8_;
      ChVariables::Get_fb((ChVectorRef *)&local_b0,(ChVariables *)&pCVar10->variables);
      if (local_a8 < 3) goto LAB_00532a29;
      uVar15 = 3;
      if (((ulong)local_b0 & 7) == 0) {
        uVar17 = -((uint)((ulong)local_b0 >> 3) & 0x1fffffff) & 7;
        if (uVar17 < 3) {
          uVar15 = uVar17;
        }
        if (uVar17 != 0) goto LAB_0053283a;
      }
      else {
LAB_0053283a:
        auVar23 = vpbroadcastq_avx512f();
        uVar19 = vpcmpuq_avx512f(auVar23,_DAT_0095aec0,5);
        bVar11 = (byte)uVar19;
        auVar24._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * (long)local_108[1];
        auVar24._0_8_ = (ulong)(bVar11 & 1) * (long)local_108[0];
        auVar24._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * (long)local_108[2];
        auVar24._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * lStack_f0;
        auVar24._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * (long)dStack_e8;
        auVar24._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * (long)dStack_e0;
        auVar24._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * (long)dStack_d8;
        auVar24._56_8_ = (uVar19 >> 7) * (long)dStack_d0;
        auVar25._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * *(long *)(*local_b0 + 8);
        auVar25._0_8_ = (ulong)(bVar11 & 1) * *(long *)*local_b0;
        auVar25._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * *(long *)(*local_b0 + 0x10);
        auVar25._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * *(long *)(*local_b0 + 0x18);
        auVar25._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * *(long *)(*local_b0 + 0x20);
        auVar25._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * *(long *)(*local_b0 + 0x28);
        auVar25._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * *(long *)(*local_b0 + 0x30);
        auVar25._56_8_ = (uVar19 >> 7) * *(long *)(*local_b0 + 0x38);
        auVar23 = vmulpd_avx512f(auVar24,_local_68);
        auVar23 = vaddpd_avx512f(auVar23,auVar25);
        auVar26._0_8_ =
             (ulong)(bVar11 & 1) * auVar23._0_8_ | (ulong)!(bool)(bVar11 & 1) * *(long *)*local_b0;
        bVar12 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar26._8_8_ = (ulong)bVar12 * auVar23._8_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 8);
        bVar12 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar26._16_8_ =
             (ulong)bVar12 * auVar23._16_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x10);
        bVar12 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar26._24_8_ =
             (ulong)bVar12 * auVar23._24_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x18);
        bVar12 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar26._32_8_ =
             (ulong)bVar12 * auVar23._32_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x20);
        bVar12 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar26._40_8_ =
             (ulong)bVar12 * auVar23._40_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x28);
        bVar12 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar26._48_8_ =
             (ulong)bVar12 * auVar23._48_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x30);
        auVar26._56_8_ =
             (uVar19 >> 7) * auVar23._56_8_ |
             (ulong)!SUB81(uVar19 >> 7,0) * *(long *)(*local_b0 + 0x38);
        *local_b0 = auVar26;
      }
      if (uVar15 < 3) {
        uVar16 = (ulong)(uVar15 << 3);
        auVar21 = vpbroadcastq_avx512vl();
        uVar19 = vpcmpuq_avx512vl(auVar21,_DAT_00955380,5);
        uVar19 = uVar19 & 0xf;
        bVar11 = (byte)uVar19;
        plVar1 = (long *)(*local_b0 + uVar16);
        pauVar2 = (undefined1 (*) [32])(*local_b0 + uVar16);
        auVar21._0_8_ =
             (ulong)(bVar11 & 1) *
             (long)((double)((ulong)(bVar11 & 1) * *(long *)((long)local_108 + uVar16)) *
                    (double)local_68._0_8_ + (double)((ulong)(bVar11 & 1) * *plVar1)) |
             (ulong)!(bool)(bVar11 & 1) * *(long *)*pauVar2;
        bVar12 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar21._8_8_ =
             (ulong)bVar12 *
             (long)((double)((ulong)((byte)(uVar19 >> 1) & 1) *
                            *(long *)((long)local_108 + uVar16 + 8)) * (double)local_68._8_8_ +
                   (double)((ulong)((byte)(uVar19 >> 1) & 1) * plVar1[1])) |
             (ulong)!bVar12 * *(long *)(*pauVar2 + 8);
        bVar12 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar21._16_8_ =
             (ulong)bVar12 *
             (long)((double)((ulong)((byte)(uVar19 >> 2) & 1) *
                            *(long *)((long)local_108 + uVar16 + 0x10)) * dStack_58 +
                   (double)((ulong)((byte)(uVar19 >> 2) & 1) * plVar1[2])) |
             (ulong)!bVar12 * *(long *)(*pauVar2 + 0x10);
        auVar21._24_8_ =
             (uVar19 >> 3) *
             (long)((double)((uVar19 >> 3) * *(long *)((long)&lStack_f0 + uVar16)) * dStack_50 +
                   (double)((uVar19 >> 3) * plVar1[3])) |
             (ulong)!SUB81(uVar19 >> 3,0) * *(long *)(*pauVar2 + 0x18);
        *pauVar2 = auVar21;
      }
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dStack_d0;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dStack_d8;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_c0;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dStack_e0;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_b8;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_c8;
      pCVar10 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar20];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dStack_d8 * dStack_d0;
      auVar3 = vfmsub231sd_fma(auVar31,auVar36,auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dStack_e0 * local_b8;
      auVar4 = vfmsub231sd_fma(auVar34,auVar41,auVar42);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_c8 * local_c0;
      auVar5 = vfmsub231sd_fma(auVar37,auVar39,auVar43);
      local_108[0] = (pCVar10->UserTorque).m_data[0] - auVar3._0_8_;
      local_108[1] = (pCVar10->UserTorque).m_data[1] - auVar4._0_8_;
      local_108[2] = (pCVar10->UserTorque).m_data[2] - auVar5._0_8_;
      ChVariables::Get_fb((ChVectorRef *)&local_b0,(ChVariables *)&pCVar10->variables);
      if (local_a8 < 6) {
LAB_00532a29:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar15 = 3;
      pauVar14 = (undefined1 (*) [64])(*local_b0 + 0x18);
      if (((ulong)pauVar14 & 7) == 0) {
        uVar17 = -((uint)((ulong)pauVar14 >> 3) & 0x1fffffff) & 7;
        if (uVar17 < 3) {
          uVar15 = uVar17;
        }
        if (uVar17 != 0) goto LAB_00532979;
      }
      else {
LAB_00532979:
        auVar23 = vpbroadcastq_avx512f();
        uVar20 = vpcmpuq_avx512f(auVar23,_DAT_0095aec0,5);
        bVar11 = (byte)uVar20;
        auVar27._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * (long)local_108[1];
        auVar27._0_8_ = (ulong)(bVar11 & 1) * (long)local_108[0];
        auVar27._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * (long)local_108[2];
        auVar27._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * lStack_f0;
        auVar27._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * (long)dStack_e8;
        auVar27._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * (long)dStack_e0;
        auVar27._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * (long)dStack_d8;
        auVar27._56_8_ = (uVar20 >> 7) * (long)dStack_d0;
        auVar28._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * *(long *)(*local_b0 + 0x20);
        auVar28._0_8_ = (ulong)(bVar11 & 1) * *(long *)*pauVar14;
        auVar28._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * *(long *)(*local_b0 + 0x28);
        auVar28._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * *(long *)(*local_b0 + 0x30);
        auVar28._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * *(long *)(*local_b0 + 0x38);
        auVar28._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * *(long *)local_b0[1];
        auVar28._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * *(long *)(local_b0[1] + 8);
        auVar28._56_8_ = (uVar20 >> 7) * *(long *)(local_b0[1] + 0x10);
        auVar23 = vmulpd_avx512f(auVar27,_local_68);
        auVar23 = vaddpd_avx512f(auVar23,auVar28);
        auVar29._0_8_ =
             (ulong)(bVar11 & 1) * auVar23._0_8_ | (ulong)!(bool)(bVar11 & 1) * *(long *)*pauVar14;
        bVar12 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar29._8_8_ = (ulong)bVar12 * auVar23._8_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x20)
        ;
        bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar29._16_8_ =
             (ulong)bVar12 * auVar23._16_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x28);
        bVar12 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar29._24_8_ =
             (ulong)bVar12 * auVar23._24_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x30);
        bVar12 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar29._32_8_ =
             (ulong)bVar12 * auVar23._32_8_ | (ulong)!bVar12 * *(long *)(*local_b0 + 0x38);
        bVar12 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar29._40_8_ = (ulong)bVar12 * auVar23._40_8_ | (ulong)!bVar12 * *(long *)local_b0[1];
        bVar12 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar29._48_8_ =
             (ulong)bVar12 * auVar23._48_8_ | (ulong)!bVar12 * *(long *)(local_b0[1] + 8);
        auVar29._56_8_ =
             (uVar20 >> 7) * auVar23._56_8_ |
             (ulong)!SUB81(uVar20 >> 7,0) * *(long *)(local_b0[1] + 0x10);
        *pauVar14 = auVar29;
      }
      if (uVar15 < 3) {
        uVar19 = (ulong)(uVar15 << 3);
        auVar21 = vpbroadcastq_avx512vl();
        uVar20 = vpcmpuq_avx512vl(auVar21,_DAT_00955380,5);
        uVar20 = uVar20 & 0xf;
        bVar11 = (byte)uVar20;
        plVar1 = (long *)(*pauVar14 + uVar19);
        pauVar2 = (undefined1 (*) [32])(*pauVar14 + uVar19);
        auVar22._0_8_ =
             (ulong)(bVar11 & 1) *
             (long)((double)((ulong)(bVar11 & 1) * *(long *)((long)local_108 + uVar19)) *
                    (double)local_68._0_8_ + (double)((ulong)(bVar11 & 1) * *plVar1)) |
             (ulong)!(bool)(bVar11 & 1) * *(long *)*pauVar2;
        bVar12 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar22._8_8_ =
             (ulong)bVar12 *
             (long)((double)((ulong)((byte)(uVar20 >> 1) & 1) *
                            *(long *)((long)local_108 + uVar19 + 8)) * (double)local_68._8_8_ +
                   (double)((ulong)((byte)(uVar20 >> 1) & 1) * plVar1[1])) |
             (ulong)!bVar12 * *(long *)(*pauVar2 + 8);
        bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar22._16_8_ =
             (ulong)bVar12 *
             (long)((double)((ulong)((byte)(uVar20 >> 2) & 1) *
                            *(long *)((long)local_108 + uVar19 + 0x10)) * dStack_58 +
                   (double)((ulong)((byte)(uVar20 >> 2) & 1) * plVar1[2])) |
             (ulong)!bVar12 * *(long *)(*pauVar2 + 0x10);
        auVar22._24_8_ =
             (uVar20 >> 3) *
             (long)((double)((uVar20 >> 3) * *(long *)((long)&lStack_f0 + uVar19)) * dStack_50 +
                   (double)((uVar20 >> 3) * plVar1[3])) |
             (ulong)!SUB81(uVar20 >> 3,0) * *(long *)(*pauVar2 + 0x18);
        *pauVar2 = auVar22;
      }
      ppCVar13 = (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      uVar20 = (ulong)uVar18;
      uVar18 = uVar18 + 1;
    } while (uVar20 < (ulong)((long)(this->particles).
                                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar13 >> 3
                             ));
  }
  return;
}

Assistant:

void ChParticleCloud::VariablesFbLoadForces(double factor) {
    ChVector<> Gforce;
    if (GetSystem())
        Gforce = GetSystem()->Get_G_acc() * particle_mass.GetBodyMass();

    for (unsigned int j = 0; j < particles.size(); j++) {
        // particle gyroscopic force:
        ChVector<> Wvel = particles[j]->GetWvel_loc();
        ChVector<> gyro = Vcross(Wvel, particle_mass.GetBodyInertia() * Wvel);

        // add applied forces and torques (and also the gyroscopic torque and gravity!) to 'fb' vector
        particles[j]->variables.Get_fb().segment(0, 3) += factor * (particles[j]->UserForce + Gforce).eigen();
        particles[j]->variables.Get_fb().segment(3, 3) += factor * (particles[j]->UserTorque - gyro).eigen();
    }
}